

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O1

void embree::setAffinity(ssize_t affinity)

{
  pthread_t __th;
  cpu_set_t cset;
  cpu_set_t local_88;
  
  local_88.__bits[0xe] = 0;
  local_88.__bits[0xf] = 0;
  local_88.__bits[0xc] = 0;
  local_88.__bits[0xd] = 0;
  local_88.__bits[10] = 0;
  local_88.__bits[0xb] = 0;
  local_88.__bits[8] = 0;
  local_88.__bits[9] = 0;
  local_88.__bits[6] = 0;
  local_88.__bits[7] = 0;
  local_88.__bits[4] = 0;
  local_88.__bits[5] = 0;
  local_88.__bits[2] = 0;
  local_88.__bits[3] = 0;
  local_88.__bits[0] = 0;
  local_88.__bits[1] = 0;
  if ((ulong)affinity < 0x400) {
    local_88.__bits[(ulong)affinity >> 6] =
         local_88.__bits[(ulong)affinity >> 6] | 1L << ((byte)affinity & 0x3f);
  }
  __th = pthread_self();
  pthread_setaffinity_np(__th,0x80,&local_88);
  return;
}

Assistant:

void setAffinity(ssize_t affinity)
  {
    cpu_set_t cset;
    CPU_ZERO(&cset);
    //size_t threadID = mapThreadID(affinity); // this is not working properly in LXC containers when some processors are disabled
    size_t threadID = affinity;
    CPU_SET(threadID, &cset);

    pthread_setaffinity_np(pthread_self(), sizeof(cset), &cset);
  }